

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O2

cell_index_t
itree_add_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn,
             cell_id_t tri_id)

{
  cell_t *pcVar1;
  cell_index_t cVar2;
  uint uVar3;
  cell_index_t end;
  cell_index_t local_2c;
  
  cVar2 = itree_find(t,&local_2c,0,left_context);
  if (cVar2 == 0xffffffff) {
    cVar2 = itree_add_sib(t,local_2c,left_context);
    cVar2 = itree_add_child(t,cVar2,right_context);
  }
  else {
    pcVar1 = t->cell;
    cVar2 = itree_find(t,&local_2c,pcVar1[cVar2].child,right_context);
    if (cVar2 != 0xffffffff) {
      cVar2 = itree_find(t,&local_2c,pcVar1[cVar2].child,posn);
      if (cVar2 != 0xffffffff) {
        return cVar2;
      }
      uVar3 = itree_add_sib(t,local_2c,posn);
      goto LAB_001102a3;
    }
    cVar2 = itree_add_sib(t,local_2c,right_context);
  }
  uVar3 = itree_add_child(t,cVar2,posn);
LAB_001102a3:
  t->cell[uVar3].child = tri_id;
  return uVar3;
}

Assistant:

cell_id_t
itree_add_tri(itree_t *t,
	      cell_id_t left_context,
	      cell_id_t right_context,
	      cell_id_t posn,
	      cell_id_t tri_id)
{
    cell_index_t end;
    cell_index_t parent;

    parent = itree_find(t, &end, 0, left_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, left_context);
	parent = itree_add_child(t, parent, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }

    parent = itree_find(t, &end, t->cell[parent].child, right_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }
    
    parent = itree_find(t, &end, t->cell[parent].child, posn);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, posn);
	
	t->cell[parent].child = tri_id;

	return parent;
    }

    return parent;
}